

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindPackageCommand.cxx
# Opt level: O1

string * __thiscall
anon_unknown.dwarf_5fb995::cmDirectoryListGenerator::GetNextCandidate
          (string *__return_storage_ptr__,cmDirectoryListGenerator *this,string *parent)

{
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar1;
  pointer pbVar2;
  pointer pcVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  bool bVar5;
  int iVar6;
  unsigned_long uVar7;
  pointer pbVar8;
  ulong dindex;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  char *fname;
  string name;
  Directory directoryLister;
  char *local_f0;
  string *local_e8;
  string *local_e0;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *local_d8;
  long *local_d0 [2];
  long local_c0 [2];
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
  local_b0;
  undefined8 local_98;
  undefined1 *local_90;
  undefined8 local_88;
  size_type local_80;
  pointer local_78;
  undefined8 local_70;
  Directory local_68;
  undefined8 local_60;
  undefined1 *local_58;
  undefined1 local_50 [32];
  
  if ((this->Matches).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      (this->Matches).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    local_e0 = __return_storage_ptr__;
    cmsys::Directory::Directory(&local_68);
    local_e8 = parent;
    cmsys::Directory::Load(&local_68,parent,(string *)0x0);
    local_d8 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&this->Matches;
    dindex = 0;
    while( true ) {
      uVar7 = cmsys::Directory::GetNumberOfFiles(&local_68);
      if (uVar7 <= dindex) break;
      local_f0 = cmsys::Directory::GetFile(&local_68,dindex);
      bVar5 = isDirentryToIgnore(local_f0);
      if (!bVar5) {
        pvVar1 = (this->Names)._M_data;
        pbVar2 = (pvVar1->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
        for (pbVar8 = (pvVar1->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start; pbVar8 != pbVar2;
            pbVar8 = pbVar8 + 1) {
          pcVar3 = (pbVar8->_M_dataplus)._M_p;
          local_d0[0] = local_c0;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_d0,pcVar3,pcVar3 + pbVar8->_M_string_length);
          (*this->_vptr_cmDirectoryListGenerator[3])(&local_b0,this,(string *)local_d0);
          if (local_d0[0] != local_c0) {
            operator_delete(local_d0[0],local_c0[0] + 1);
          }
          iVar6 = cmsysString_strncasecmp
                            (local_f0,(char *)local_b0.first._M_len,(size_t)local_b0.first._M_str);
          if (iVar6 == 0) {
            bVar5 = cmsys::Directory::FileIsDirectory(&local_68,dindex);
            if (bVar5) {
              std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
              emplace_back<char_const*const&>(local_d8,&local_f0);
            }
          }
          if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
              local_b0.first._M_len != &local_b0.second) {
            operator_delete((void *)local_b0.first._M_len,
                            (ulong)((long)&((local_b0.second)->_M_dataplus)._M_p + 1));
          }
        }
      }
      dindex = dindex + 1;
    }
    (*this->_vptr_cmDirectoryListGenerator[2])(this);
    (this->Current)._M_current =
         (this->Matches).
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    cmsys::Directory::~Directory(&local_68);
    parent = local_e8;
    __return_storage_ptr__ = local_e0;
  }
  pbVar4 = (this->Current)._M_current;
  if (pbVar4 == (this->Matches).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  }
  else {
    (this->Current)._M_current = pbVar4 + 1;
    local_b0.first._M_str = (parent->_M_dataplus)._M_p;
    local_b0.first._M_len = parent->_M_string_length;
    local_b0.second = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    local_90 = local_50;
    local_68.Internal = (DirectoryInternals *)0x0;
    local_60 = 1;
    local_50[0] = 0x2f;
    local_98 = 1;
    local_88 = 0;
    local_78 = (pbVar4->_M_dataplus)._M_p;
    local_80 = pbVar4->_M_string_length;
    local_70 = 0;
    views._M_len = 3;
    views._M_array = &local_b0;
    local_58 = local_90;
    cmCatViews(__return_storage_ptr__,views);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string GetNextCandidate(const std::string& parent)
  {
    // Construct a list of matches if not yet
    if (this->Matches.empty()) {
      cmsys::Directory directoryLister;
      // ALERT `Directory::Load()` keeps only names
      // internally and LOST entry type from `dirent`.
      // So, `Directory::FileIsDirectory` gonna use
      // `SystemTools::FileIsDirectory()` and waste a syscall.
      // TODO Need to enhance the `Directory` class.
      directoryLister.Load(parent);

      // ATTENTION Is it guaranteed that first two entries are
      // `.` and `..`?
      // TODO If so, just start with index 2 and drop the
      // `isDirentryToIgnore(i)` condition to check.
      for (auto i = 0ul; i < directoryLister.GetNumberOfFiles(); ++i) {
        const char* const fname = directoryLister.GetFile(i);
        if (isDirentryToIgnore(fname)) {
          continue;
        }

        for (const auto& n : this->Names.get()) {
          // NOTE Customization point for `cmMacProjectDirectoryListGenerator`
          const auto name = this->TransformNameBeforeCmp(n);
          // Skip entries that don't match and non-directories.
          // ATTENTION BTW, original code also didn't check if it's a symlink
          // to a directory!
          const auto equal =
            (cmsysString_strncasecmp(fname, name.c_str(), name.length()) == 0);
          if (equal && directoryLister.FileIsDirectory(i)) {
            this->Matches.emplace_back(fname);
          }
        }
      }
      // NOTE Customization point for `cmProjectDirectoryListGenerator`
      this->OnMatchesLoaded();

      this->Current = this->Matches.cbegin();
    }

    if (this->Current != this->Matches.cend()) {
      auto candidate = cmStrCat(parent, '/', *this->Current++);
      return candidate;
    }

    return {};
  }